

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O0

bool __thiscall pstore::indirect_string::operator==(indirect_string *this,indirect_string *rhs)

{
  bool bVar1;
  bool equal;
  indirect_string *rhs_local;
  indirect_string *this_local;
  
  if (this->db_ != rhs->db_) {
    assert_failed("&db_ == &rhs.db_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/indirect_string.cpp"
                  ,0x41);
  }
  if (((this->is_pointer_ & 1U) == 0) && ((rhs->is_pointer_ & 1U) == 0)) {
    this_local._7_1_ = (this->field_2).address_ == (rhs->field_2).address_;
    bVar1 = equal_contents(this,rhs);
    if (bVar1 != this_local._7_1_) {
      assert_failed("this->equal_contents (rhs) == equal",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/indirect_string.cpp"
                    ,0x47);
    }
  }
  else if (((this->is_pointer_ & 1U) == 0) ||
          (((rhs->is_pointer_ & 1U) == 0 || ((this->field_2).address_ != (rhs->field_2).address_))))
  {
    this_local._7_1_ = equal_contents(this,rhs);
  }
  else {
    bVar1 = equal_contents(this,rhs);
    if (!bVar1) {
      assert_failed("this->equal_contents (rhs)",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/indirect_string.cpp"
                    ,0x4e);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool indirect_string::operator== (indirect_string const & rhs) const {
        PSTORE_ASSERT (&db_ == &rhs.db_);
        if (!is_pointer_ && !rhs.is_pointer_) {
            // We define that all strings in the database are unique. That means
            // that if both this and the rhs string are in the store then we can
            // simply compare their addresses.
            auto const equal = address_ == rhs.address_;
            PSTORE_ASSERT (this->equal_contents (rhs) == equal);
            return equal;
        }
        if (is_pointer_ && rhs.is_pointer_ && str_ == rhs.str_) {
            // Note that we can't immediately return false if str_ != rhs.str_
            // because two strings with different address may still have identical
            // contents.
            PSTORE_ASSERT (this->equal_contents (rhs));
            return true;
        }
        return equal_contents (rhs);
    }